

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

longlong tinyexr::getBits(int nBits,longlong *c,int *lc,char **in)

{
  long lVar1;
  byte *pbVar2;
  int iVar3;
  
  iVar3 = *lc;
  while (iVar3 < nBits) {
    lVar1 = *c;
    pbVar2 = (byte *)*in;
    *in = (char *)(pbVar2 + 1);
    *c = (ulong)*pbVar2 | lVar1 << 8;
    iVar3 = *lc + 8;
    *lc = iVar3;
  }
  *lc = iVar3 - nBits;
  return (ulong)((uint)(*c >> ((byte)(iVar3 - nBits) & 0x3f)) & ~(-1 << ((byte)nBits & 0x1f)));
}

Assistant:

inline long long getBits(int nBits, long long &c, int &lc, const char *&in) {
  while (lc < nBits) {
    c = (c << 8) | *(reinterpret_cast<const unsigned char *>(in++));
    lc += 8;
  }

  lc -= nBits;
  return (c >> lc) & ((1 << nBits) - 1);
}